

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxintegration.cpp
# Opt level: O2

void __thiscall QGLXContext::swapBuffers(QGLXContext *this,QPlatformSurface *surface)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  
  QPlatformSurface::surface();
  iVar2 = QSurface::surfaceClass();
  if (iVar2 == 1) {
    uVar3 = *(ulong *)(surface + 0x30);
  }
  else {
    uVar3 = (ulong)*(uint *)(surface + 0x20);
  }
  glXSwapBuffers(*(undefined8 *)(this + 0x18),uVar3);
  QPlatformSurface::surface();
  iVar2 = QSurface::surfaceClass();
  if (iVar2 == 0) {
    cVar1 = QXcbWindow::needsSync();
    if (cVar1 != '\0') {
      QXcbWindow::postSyncWindowRequest();
      return;
    }
  }
  return;
}

Assistant:

void QGLXContext::swapBuffers(QPlatformSurface *surface)
{
    GLXDrawable glxDrawable = 0;
    if (surface->surface()->surfaceClass() == QSurface::Offscreen)
        glxDrawable = static_cast<QGLXPbuffer *>(surface)->pbuffer();
    else
        glxDrawable = static_cast<QXcbWindow *>(surface)->xcb_window();
    glXSwapBuffers(m_display, glxDrawable);

    if (surface->surface()->surfaceClass() == QSurface::Window) {
        QXcbWindow *platformWindow = static_cast<QXcbWindow *>(surface);
        // OpenGL context might be bound to a non-gui thread use QueuedConnection to sync
        // the window from the platformWindow's thread as QXcbWindow is no QObject, an
        // event is sent to QXcbConnection. (this is faster than a metacall)
        if (platformWindow->needsSync())
            platformWindow->postSyncWindowRequest();
    }
}